

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stop_Freeze_R_PDU.cpp
# Opt level: O1

void __thiscall
KDIS::PDU::Stop_Freeze_R_PDU::Decode(Stop_Freeze_R_PDU *this,KDataStream *stream,bool ignoreHeader)

{
  KUINT16 KVar1;
  KException *this_00;
  int iVar2;
  undefined7 in_register_00000011;
  KString local_40;
  
  KVar1 = KDataStream::GetBufferSize(stream);
  iVar2 = 0xc;
  if ((int)CONCAT71(in_register_00000011,ignoreHeader) == 0) {
    iVar2 = 0;
  }
  if (0x27 < iVar2 + (uint)KVar1) {
    Simulation_Management_Header::Decode((Simulation_Management_Header *)this,stream,ignoreHeader);
    (*(this->super_Stop_Freeze_PDU).m_RealWorldTime.super_DataTypeBase._vptr_DataTypeBase[3])
              (&(this->super_Stop_Freeze_PDU).m_RealWorldTime,stream);
    KDataStream::Read(stream,&(this->super_Stop_Freeze_PDU).m_ui8Reason);
    KDataStream::Read(stream,&(this->super_Stop_Freeze_PDU).m_ui8FrozenBehaviour);
    KDataStream::Read(stream,&(this->super_Reliability_Header).m_ui8ReqRelSrv);
    KDataStream::Read(stream,&(this->super_Stop_Freeze_PDU).super_Simulation_Management_Header.
                              super_Header.super_Header6.m_ui8Padding2);
    KDataStream::Read<unsigned_int>(stream,&(this->super_Stop_Freeze_PDU).m_ui32RequestID);
    return;
  }
  this_00 = (KException *)__cxa_allocate_exception(0x30);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_40,"Decode","");
  KException::KException(this_00,&local_40,2);
  __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
}

Assistant:

void Stop_Freeze_R_PDU::Decode(KDataStream &stream, bool ignoreHeader /*= true*/ ) noexcept(false)
{
    if( ( stream.GetBufferSize() + ( ignoreHeader ? Header::HEADER6_PDU_SIZE : 0 ) ) < STOP_FREEZE_R_PDU_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    Simulation_Management_Header::Decode( stream, ignoreHeader );

    stream >> KDIS_STREAM m_RealWorldTime
           >> m_ui8Reason
           >> m_ui8FrozenBehaviour
           >> m_ui8ReqRelSrv
           >> m_ui8Padding2
           >> m_ui32RequestID;
}